

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaValidator::preContentValidation
          (SchemaValidator *this,bool param_1,bool validateDefAttr)

{
  CreateReasons CVar1;
  XercesGroupInfo *pXVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SchemaGrammar *this_00;
  SchemaElementDecl *this_01;
  XMLCh *pXVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  undefined4 extraout_var_00;
  XMLCh *pXVar10;
  ComplexTypeInfo *this_02;
  XercesGroupInfo *curGroup;
  XMLScanner *this_03;
  XMLCh *text2;
  ulong uVar11;
  Codes toEmit;
  ArrayJanitor<char16_t> janList;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *local_e8;
  XMLSize_t local_e0;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *local_d8;
  RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> groupEnum;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  undefined4 extraout_var;
  
  GrammarResolver::getGrammarEnumerator(&grammarEnum,this->fGrammarResolver);
LAB_0030b2db:
  do {
    if ((grammarEnum.fCurElem == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
       (grammarEnum.fCurHash == (grammarEnum.fToEnum)->fHashModulus)) {
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator(&grammarEnum);
      return;
    }
    this_00 = (SchemaGrammar *)
              RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::nextElement
                        (&grammarEnum);
    iVar5 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[5])(this_00);
  } while ((iVar5 != 1) ||
          (iVar5 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[7])(this_00),
          (char)iVar5 != '\0'));
  (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[0x13])(this_00,1);
  SchemaGrammar::getElemEnumerator(&elemEnum,this_00);
  do {
    if ((elemEnum.fCurIndex == 0) || ((elemEnum.fToEnum)->fIdCounter < elemEnum.fCurIndex)) break;
    this_01 = RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
              ::nextElement(&elemEnum);
    CVar1 = (this_01->super_XMLElementDecl).fCreateReason;
    if (CVar1 == AsRootElem) {
      pXVar6 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
      XMLValidator::emitError
                (&this->super_XMLValidator,UndeclaredElemInDocType,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    else {
      if (CVar1 == InContentModel) {
        this_03 = (this->super_XMLValidator).fScanner;
        pXVar6 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        toEmit = UndeclaredElemInCM;
      }
      else {
        if (CVar1 != AttList) goto LAB_0030b3e1;
        this_03 = (this->super_XMLValidator).fScanner;
        pXVar6 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
        toEmit = UndeclaredElemInAttList;
      }
      XMLScanner::emitError(this_03,toEmit,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
LAB_0030b3e1:
    iVar5 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(this_01);
    if ((char)iVar5 != '\0') {
      iVar5 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])(this_01)
      ;
      plVar7 = (long *)CONCAT44(extraout_var,iVar5);
      bVar3 = false;
      for (uVar11 = 0; uVar8 = (**(code **)(*plVar7 + 0x50))(plVar7), uVar11 < uVar8;
          uVar11 = uVar11 + 1) {
        plVar9 = (long *)(**(code **)(*plVar7 + 0x58))(plVar7,uVar11);
        bVar4 = bVar3;
        if (*(int *)((long)plVar9 + 0xc) == 8) {
          if ((XMLCh *)plVar9[5] != (XMLCh *)0x0) {
            pXVar6 = XMLString::replicate((XMLCh *)plVar9[5],this->fMemoryManager);
            ArrayJanitor<char16_t>::ArrayJanitor(&janList,pXVar6,this->fMemoryManager);
            text2 = pXVar6;
LAB_0030b498:
            do {
              pXVar10 = pXVar6;
              pXVar6 = pXVar10 + 1;
              if (*pXVar10 == L'\0') {
                bVar3 = true;
              }
              else {
                if (*pXVar10 != L' ') goto LAB_0030b498;
                *pXVar10 = L'\0';
                bVar3 = false;
              }
              iVar5 = (*(this_00->super_Grammar).super_XSerializable._vptr_XSerializable[0xf])
                                (this_00,text2);
              if (CONCAT44(extraout_var_00,iVar5) == 0) {
                pXVar10 = (XMLCh *)(**(code **)(*plVar9 + 0x28))(plVar9);
                XMLValidator::emitError
                          (&this->super_XMLValidator,UnknownNotRefAttr,pXVar10,text2,(XMLCh *)0x0,
                           (XMLCh *)0x0);
              }
              text2 = pXVar6;
            } while (!bVar3);
            ArrayJanitor<char16_t>::~ArrayJanitor(&janList);
          }
        }
        else if ((*(int *)((long)plVar9 + 0xc) == 1) && (bVar4 = true, bVar3)) {
          pXVar6 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          XMLValidator::emitError
                    (&this->super_XMLValidator,MultipleIdAttrs,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          break;
        }
        bVar3 = bVar4;
        if ((validateDefAttr) && (plVar9[4] != 0)) {
          (*(this->super_XMLValidator)._vptr_XMLValidator[8])(this,plVar9);
        }
      }
    }
  } while( true );
  if (((this->super_XMLValidator).fScanner)->fSchemaFullChecking == true) {
    RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
               &janList,this_00->fComplexTypeRegistry,false,this->fMemoryManager);
    while ((local_e8 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0 ||
           (local_e0 != local_d8->fHashModulus))) {
      this_02 = RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
                nextElement((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                             *)&janList);
      ComplexTypeInfo::checkUniqueParticleAttribution
                (this_02,this_00,this->fGrammarResolver,this->fGrammarResolver->fStringPool,
                 &this->super_XMLValidator);
      checkParticleDerivation(this,this_00,this_02);
      checkRefElementConsistency(this,this_00,this_02,(XercesGroupInfo *)0x0);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&groupEnum,this_00->fGroupInfoRegistry,false,this->fMemoryManager);
    while ((groupEnum.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0 ||
           (groupEnum.fCurHash != (groupEnum.fToEnum)->fHashModulus))) {
      curGroup = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
                 nextElement(&groupEnum);
      pXVar2 = curGroup->fBaseGroup;
      if (pXVar2 != (XercesGroupInfo *)0x0) {
        checkParticleDerivationOk
                  (this,this_00,curGroup->fContentSpec,curGroup->fScope,pXVar2->fContentSpec,
                   pXVar2->fScope,(ComplexTypeInfo *)0x0,true);
      }
      if (curGroup->fCheckElementConsistency == true) {
        checkRefElementConsistency(this,this_00,(ComplexTypeInfo *)0x0,curGroup);
      }
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&groupEnum);
    RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
               &janList);
  }
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
  ~RefHash3KeysIdPoolEnumerator(&elemEnum);
  goto LAB_0030b2db;
}

Assistant:

void SchemaValidator::preContentValidation(bool,
                                           bool validateDefAttr)
{
    //  Lets go through all the grammar in the GrammarResolver
    //    and validate those that has not been validated yet
    //
    //  Lets enumerate all of the elements in the element decl pool
    //    and put out an error for any that did not get declared.
    //    We also check all of the attributes as well.
    //
    //  And enumerate all the complextype info in the grammar
    //    and do Unique Particle Attribution Checking

    RefHashTableOfEnumerator<Grammar> grammarEnum = fGrammarResolver->getGrammarEnumerator();
    while (grammarEnum.hasMoreElements())
    {
        Grammar& grammar = grammarEnum.nextElement();
        if (grammar.getGrammarType() != Grammar::SchemaGrammarType || grammar.getValidated())
             continue;
        SchemaGrammar& sGrammar = (SchemaGrammar&) grammar;
        sGrammar.setValidated(true);

        RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = sGrammar.getElemEnumerator();

        while (elemEnum.hasMoreElements())
        {
            SchemaElementDecl& curElem = elemEnum.nextElement();

            //  First check if declared or not
            //
            //  See if this element decl was ever marked as declared. If
            //  not, then put out an error. In some cases its just
            //  a warning, such as being referenced in a content model.
            //
            const SchemaElementDecl::CreateReasons reason = curElem.getCreateReason();

            if (reason != XMLElementDecl::Declared)
            {
                if (reason == XMLElementDecl::AttList)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInAttList
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::AsRootElem)
                {
                    emitError
                    (
                        XMLValid::UndeclaredElemInDocType
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::InContentModel)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInCM
                        , curElem.getFullName()
                    );
                }
                else
                {
                }
            }

            //
            //  Then check all of the attributes of the current element.
            //  We check for:
            //
            //  1) Multiple ID attributes
            //  2) That all of the default values of attributes are
            //      valid for their type.
            //  3) That for any notation types, that their lists
            //      of possible values refer to declared notations.
            //
            if (curElem.hasAttDefs()) {
                XMLAttDefList& attDefList = curElem.getAttDefList();
                bool seenId = false;

                for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
                {
                    const XMLAttDef& curAttDef = attDefList.getAttDef(i);

                    if (curAttDef.getType() == XMLAttDef::ID)
                    {
                        if (seenId)
                        {
                            emitError
                            (
                                XMLValid::MultipleIdAttrs
                                , curElem.getFullName()
                            );
                            break;
                        }

                        seenId = true;
                    }
                     else if (curAttDef.getType() == XMLAttDef::Notation && curAttDef.getEnumeration())
                    {
                        //
                        //  We need to verify that all of its possible values
                        //  (in the enum list) refer to valid notations.
                        //
                        XMLCh* list = XMLString::replicate(curAttDef.getEnumeration(), fMemoryManager);
                        ArrayJanitor<XMLCh> janList(list, fMemoryManager);

                        //
                        //  Search forward for a space or a null. If a null,
                        //  we are done. If a space, cap it and look it up.
                        //
                        bool    breakFlag = false;
                        XMLCh*  listPtr = list;
                        XMLCh*  lastPtr = listPtr;
                        while (true)
                        {
                            while (*listPtr && (*listPtr != chSpace))
                                listPtr++;

                            //
                            //  If at the end, indicate we need to break after
                            //  this one. Else, cap it off here.
                            //
                            if (!*listPtr)
                                breakFlag = true;
                            else
                                *listPtr = chNull;

                            if (!sGrammar.getNotationDecl(lastPtr))
                            {
                                emitError
                                (
                                    XMLValid::UnknownNotRefAttr
                                    , curAttDef.getFullName()
                                    , lastPtr
                                );
                            }

                            // Break out if we hit the end last time
                            if (breakFlag)
                                break;

                            // Else move upwards and try again
                            listPtr++;
                            lastPtr = listPtr;
                        }
                    }

                    // If it has a default/fixed value, then validate it
                    if (validateDefAttr && curAttDef.getValue())
                    {
                        validateAttrValue
                        (
                            &curAttDef
                            , curAttDef.getValue()
                            , true
                            , &curElem
                        );
                    }
                }
            }
        }

        //  For each complex type info, check the Unique Particle Attribution
        if (getScanner()->getValidationSchemaFullChecking()) {
            RefHashTableOf<ComplexTypeInfo>* complexTypeRegistry = sGrammar.getComplexTypeRegistry();

            RefHashTableOfEnumerator<ComplexTypeInfo> complexTypeEnum(complexTypeRegistry, false, fMemoryManager);
            while (complexTypeEnum.hasMoreElements())
            {
                ComplexTypeInfo& curTypeInfo = complexTypeEnum.nextElement();
                curTypeInfo.checkUniqueParticleAttribution(&sGrammar, fGrammarResolver, fGrammarResolver->getStringPool(), this);
                checkParticleDerivation(&sGrammar, &curTypeInfo);
                checkRefElementConsistency(&sGrammar, &curTypeInfo);
            }

            RefHashTableOf<XercesGroupInfo>* groupInfoRegistry = sGrammar.getGroupInfoRegistry();
            RefHashTableOfEnumerator<XercesGroupInfo> groupEnum(groupInfoRegistry, false, fMemoryManager);

            while (groupEnum.hasMoreElements()) {

                XercesGroupInfo& curGroup = groupEnum.nextElement();
                XercesGroupInfo* baseGroup = curGroup.getBaseGroup();

                if (baseGroup) {
                    try {
                        checkParticleDerivationOk(&sGrammar, curGroup.getContentSpec(), curGroup.getScope(),
                                                  baseGroup->getContentSpec(), baseGroup->getScope());
                    }
                    catch (const XMLException& excep) {
                        fSchemaErrorReporter.emitError(excep, curGroup.getLocator());
					}
                }

                if (curGroup.getCheckElementConsistency())
                    checkRefElementConsistency(&sGrammar, 0, &curGroup);
            }
        }
    }
}